

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O3

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  short *psVar2;
  uv_loop_t *puVar3;
  ulong uVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_loop_t *unaff_RBX;
  undefined7 uVar5;
  code *addr_00;
  uv_udp_t *puVar6;
  char *pcVar7;
  uv_udp_send_t *loop;
  uv_udp_send_t *puVar8;
  uv_udp_send_t *req;
  int in_R8D;
  bool bVar9;
  sockaddr_in6 addr;
  uv_buf_t uStack_c0;
  sockaddr_in6 sStack_ac;
  uv_loop_t *puStack_90;
  char acStack_88 [64];
  code *pcStack_48;
  code *pcStack_40;
  int local_34;
  uv_loop_t *local_30;
  
  pcStack_40 = (code *)0x17810e;
  iVar1 = uv_interface_addresses((uv_interface_address_t **)&stack0xffffffffffffffd0,&local_34);
  if (iVar1 == 0) {
    puVar3 = local_30;
    if ((long)local_34 < 1) {
LAB_001782c7:
      pcStack_40 = (code *)0x1782cc;
      uv_free_interface_addresses((uv_interface_address_t *)puVar3,local_34);
    }
    else {
      psVar2 = (short *)((long)local_30->handle_queue + 4);
      uVar4 = 1;
      do {
        uVar5 = (undefined7)((ulong)unaff_RBX >> 8);
        unaff_RBX = (uv_loop_t *)CONCAT71(uVar5,1);
        if (*psVar2 == 10) {
          unaff_RBX = (uv_loop_t *)CONCAT71(uVar5,*(int *)(psVar2 + -2) != 0);
        }
        if ((char)unaff_RBX == '\0') break;
        psVar2 = psVar2 + 0x28;
        bVar9 = uVar4 < (ulong)(long)local_34;
        uVar4 = uVar4 + 1;
      } while (bVar9);
      pcStack_40 = (code *)0x17815a;
      uv_free_interface_addresses((uv_interface_address_t *)local_30,local_34);
      if ((char)unaff_RBX == '\0') {
        loop = (uv_udp_send_t *)0x1998f9;
        addr_00 = (code *)0x23a3;
        pcStack_40 = (code *)0x178178;
        iVar1 = uv_ip6_addr("::",0x23a3,(sockaddr_in6 *)&stack0xffffffffffffffd0);
        if (iVar1 == 0) {
          pcStack_40 = (code *)0x178185;
          loop = (uv_udp_send_t *)uv_default_loop();
          puVar6 = &server;
          pcStack_40 = (code *)0x178194;
          iVar1 = uv_udp_init((uv_loop_t *)loop,&server);
          addr_00 = (code *)puVar6;
          if (iVar1 != 0) goto LAB_00178352;
          pcStack_40 = (code *)0x1781a1;
          loop = (uv_udp_send_t *)uv_default_loop();
          puVar6 = &client;
          pcStack_40 = (code *)0x1781b0;
          iVar1 = uv_udp_init((uv_loop_t *)loop,&client);
          addr_00 = (code *)puVar6;
          if (iVar1 != 0) goto LAB_00178357;
          puVar6 = &server;
          addr_00 = (code *)&stack0xffffffffffffffd0;
          pcStack_40 = (code *)0x1781cb;
          iVar1 = uv_udp_bind(&server,(sockaddr *)addr_00,0);
          loop = (uv_udp_send_t *)puVar6;
          if (iVar1 != 0) goto LAB_0017835c;
          puVar6 = &server;
          pcVar7 = "ff02::1";
          pcStack_40 = (code *)0x1781ed;
          iVar1 = uv_udp_set_membership(&server,"ff02::1",(char *)0x0,UV_JOIN_GROUP);
          if (iVar1 == 0) {
            puVar6 = &server;
            addr_00 = alloc_cb;
            pcStack_40 = (code *)0x17820f;
            iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
            loop = (uv_udp_send_t *)puVar6;
            if (iVar1 != 0) goto LAB_00178366;
            loop = &::req;
            pcStack_40 = (code *)0x178223;
            iVar1 = do_send(&::req);
            if (iVar1 != 0) goto LAB_0017836b;
            if (close_cb_called != 0) goto LAB_00178370;
            if (cl_recv_cb_called != 0) goto LAB_00178375;
            if (sv_send_cb_called != 0) goto LAB_0017837a;
            pcStack_40 = (code *)0x178257;
            loop = (uv_udp_send_t *)uv_default_loop();
            addr_00 = (code *)0x0;
            pcStack_40 = (code *)0x178261;
            uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
            if (cl_recv_cb_called != 2) goto LAB_0017837f;
            if (sv_send_cb_called != 2) goto LAB_00178384;
            if (close_cb_called == 2) {
              pcStack_40 = (code *)0x17828d;
              puVar3 = uv_default_loop();
              pcStack_40 = (code *)0x1782a3;
              uv_walk(puVar3,close_walk_cb,(void *)0x0);
              local_34 = 0;
              pcStack_40 = (code *)0x1782ad;
              uv_run(puVar3,UV_RUN_DEFAULT);
              pcStack_40 = (code *)0x1782b2;
              puVar3 = uv_default_loop();
              pcStack_40 = (code *)0x1782ba;
              iVar1 = uv_loop_close(puVar3);
              if (iVar1 == 0) {
                return 0;
              }
              pcStack_40 = (code *)0x1782c7;
              run_test_udp_multicast_join6_cold_13();
              goto LAB_001782c7;
            }
            goto LAB_00178389;
          }
          addr_00 = (code *)pcVar7;
          loop = (uv_udp_send_t *)puVar6;
          if (iVar1 != -0x13) goto LAB_00178361;
          pcStack_40 = (code *)0x1782e1;
          unaff_RBX = uv_default_loop();
          pcStack_40 = (code *)0x1782f5;
          uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
          addr_00 = (code *)0x0;
          pcStack_40 = (code *)0x1782ff;
          uv_run(unaff_RBX,UV_RUN_DEFAULT);
          pcStack_40 = (code *)0x178304;
          puVar3 = uv_default_loop();
          pcStack_40 = (code *)0x17830c;
          iVar1 = uv_loop_close(puVar3);
          loop = (uv_udp_send_t *)_stderr;
          if (iVar1 == 0) {
            pcStack_40 = (code *)0x17832f;
            fprintf((FILE *)_stderr,"%s\n","No ipv6 multicast route");
            goto LAB_0017832f;
          }
        }
        else {
          pcStack_40 = (code *)0x178352;
          run_test_udp_multicast_join6_cold_1();
LAB_00178352:
          pcStack_40 = (code *)0x178357;
          run_test_udp_multicast_join6_cold_2();
LAB_00178357:
          pcStack_40 = (code *)0x17835c;
          run_test_udp_multicast_join6_cold_3();
LAB_0017835c:
          pcStack_40 = (code *)0x178361;
          run_test_udp_multicast_join6_cold_4();
LAB_00178361:
          pcStack_40 = (code *)0x178366;
          run_test_udp_multicast_join6_cold_15();
LAB_00178366:
          pcStack_40 = (code *)0x17836b;
          run_test_udp_multicast_join6_cold_5();
LAB_0017836b:
          pcStack_40 = (code *)0x178370;
          run_test_udp_multicast_join6_cold_6();
LAB_00178370:
          pcStack_40 = (code *)0x178375;
          run_test_udp_multicast_join6_cold_7();
LAB_00178375:
          pcStack_40 = (code *)0x17837a;
          run_test_udp_multicast_join6_cold_8();
LAB_0017837a:
          pcStack_40 = (code *)0x17837f;
          run_test_udp_multicast_join6_cold_9();
LAB_0017837f:
          pcStack_40 = (code *)0x178384;
          run_test_udp_multicast_join6_cold_10();
LAB_00178384:
          pcStack_40 = (code *)0x178389;
          run_test_udp_multicast_join6_cold_11();
LAB_00178389:
          pcStack_40 = (code *)0x17838e;
          run_test_udp_multicast_join6_cold_12();
        }
        pcStack_40 = alloc_cb;
        run_test_udp_multicast_join6_cold_14();
        req = (uv_udp_send_t *)
              CONCAT71(0x560d,loop == (uv_udp_send_t *)&client || loop == (uv_udp_send_t *)&server);
        if (loop == (uv_udp_send_t *)&client || loop == (uv_udp_send_t *)&server) {
          if (addr_00 < (uv_udp_t *)0x10001) {
            *extraout_RDX = alloc_cb::slab;
            extraout_RDX[1] = 0x10000;
            return extraout_EAX;
          }
        }
        else {
          pcStack_48 = (code *)0x1783d4;
          alloc_cb_cold_1();
        }
        pcStack_48 = cl_recv_cb;
        alloc_cb_cold_2();
        bVar9 = loop == (uv_udp_send_t *)&server;
        puVar8 = (uv_udp_send_t *)
                 CONCAT71((int7)((ulong)loop >> 8),loop == (uv_udp_send_t *)&client || bVar9);
        if (loop == (uv_udp_send_t *)&client || bVar9) {
          if (in_R8D != 0) goto LAB_001784d6;
          if ((long)addr_00 < 0) goto LAB_001784db;
          if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x0) {
            if (req == (uv_udp_send_t *)0x0) goto LAB_001784e0;
            if ((uv_udp_t *)addr_00 != (uv_udp_t *)0x4) goto LAB_001784e5;
            if (*(int *)*extraout_RDX_00 == 0x474e4950) {
              cl_recv_cb_called = cl_recv_cb_called + 1;
              if (cl_recv_cb_called == 2) {
                uv_close((uv_handle_t *)&server,close_cb);
                return extraout_EAX_00;
              }
              goto LAB_0017846b;
            }
            goto LAB_001784ea;
          }
          if (req == (uv_udp_send_t *)0x0) {
            return (int)CONCAT71(0x560c,bVar9);
          }
          puStack_90 = (uv_loop_t *)0x17846b;
          cl_recv_cb_cold_10();
LAB_0017846b:
          puStack_90 = (uv_loop_t *)0x17847b;
          iVar1 = uv_ip6_name((sockaddr_in6 *)req,acStack_88,0x40);
          if (iVar1 != 0) goto LAB_001784ef;
          puVar6 = &server;
          puStack_90 = (uv_loop_t *)0x178496;
          iVar1 = uv_udp_set_membership(&server,"ff02::1",(char *)0x0,UV_LEAVE_GROUP);
          req = (uv_udp_send_t *)puVar6;
          if (iVar1 != 0) goto LAB_001784f4;
          puVar6 = &server;
          puStack_90 = (uv_loop_t *)0x1784b8;
          iVar1 = uv_udp_set_source_membership
                            (&server,"ff02::1",(char *)0x0,acStack_88,UV_JOIN_GROUP);
          req = (uv_udp_send_t *)puVar6;
          if (iVar1 == 0) {
            req = &req_ss;
            puStack_90 = (uv_loop_t *)0x1784c8;
            iVar1 = do_send(&req_ss);
            if (iVar1 == 0) {
              return 0;
            }
            goto LAB_001784fe;
          }
        }
        else {
          puStack_90 = (uv_loop_t *)0x1784d6;
          cl_recv_cb_cold_1();
LAB_001784d6:
          puStack_90 = (uv_loop_t *)0x1784db;
          cl_recv_cb_cold_2();
LAB_001784db:
          puStack_90 = (uv_loop_t *)0x1784e0;
          cl_recv_cb_cold_11();
LAB_001784e0:
          puStack_90 = (uv_loop_t *)0x1784e5;
          cl_recv_cb_cold_9();
LAB_001784e5:
          puStack_90 = (uv_loop_t *)0x1784ea;
          cl_recv_cb_cold_3();
LAB_001784ea:
          req = puVar8;
          puStack_90 = (uv_loop_t *)0x1784ef;
          cl_recv_cb_cold_4();
LAB_001784ef:
          puStack_90 = (uv_loop_t *)0x1784f4;
          cl_recv_cb_cold_5();
LAB_001784f4:
          puStack_90 = (uv_loop_t *)0x1784f9;
          cl_recv_cb_cold_6();
        }
        puStack_90 = (uv_loop_t *)0x1784fe;
        cl_recv_cb_cold_7();
LAB_001784fe:
        puStack_90 = (uv_loop_t *)do_send;
        cl_recv_cb_cold_8();
        puStack_90 = unaff_RBX;
        uStack_c0 = uv_buf_init("PING",4);
        pcVar7 = "ff02::1";
        iVar1 = uv_ip6_addr("ff02::1",0x23a3,&sStack_ac);
        if (iVar1 == 0) {
          iVar1 = uv_udp_send(req,&client,&uStack_c0,1,(sockaddr *)&sStack_ac,sv_send_cb);
          return iVar1;
        }
        do_send_cold_1();
        iVar1 = uv_is_closing((uv_handle_t *)pcVar7);
        if (iVar1 == 0) {
          uv_close((uv_handle_t *)pcVar7,(uv_close_cb)0x0);
          return extraout_EAX_01;
        }
        return iVar1;
      }
    }
  }
  pcStack_40 = (code *)0x1782d1;
  run_test_udp_multicast_join6_cold_16();
LAB_0017832f:
  pcStack_40 = (code *)0x17833e;
  fflush((FILE *)_stderr);
  return 1;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}